

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

void expectEqualIssuesCellmlElementTypesLevelsReferenceRulesUrls
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *issues,vector<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_>
                        *cellmlElementTypes,
               vector<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_> *levels,
               vector<libcellml::Issue::ReferenceRule,_std::allocator<libcellml::Issue::ReferenceRule>_>
               *referenceRules,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *urls,LoggerPtr *logger)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  bool bVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  const_reference pvVar6;
  const_reference lhs;
  const_reference lhs_00;
  const_reference lhs_01;
  AssertHelper local_298 [8];
  Message local_290 [8];
  shared_ptr<libcellml::Issue> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_9;
  Message local_240 [8];
  shared_ptr<libcellml::Issue> local_238;
  ReferenceRule local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_8;
  Message local_208 [8];
  shared_ptr<libcellml::Issue> local_200;
  Level local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_7;
  Message local_1d0 [8];
  shared_ptr<libcellml::Issue> local_1c8;
  shared_ptr<libcellml::AnyCellmlElement> local_1b8;
  CellmlElementType local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_6;
  Message local_188 [8];
  shared_ptr<libcellml::Issue> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_5;
  size_t i;
  Message local_130 [8];
  unsigned_long local_128;
  size_type local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_4;
  Message local_100 [8];
  unsigned_long local_f8;
  size_type local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_3;
  Message local_d0 [8];
  unsigned_long local_c8;
  size_type local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_2;
  Message local_a0 [8];
  unsigned_long local_98;
  size_type local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70 [24];
  unsigned_long local_58;
  size_type local_50;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  LoggerPtr *logger_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *urls_local;
  vector<libcellml::Issue::ReferenceRule,_std::allocator<libcellml::Issue::ReferenceRule>_>
  *referenceRules_local;
  vector<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_> *levels_local;
  vector<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_>
  *cellmlElementTypes_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *issues_local;
  
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)logger;
  local_50 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(issues);
  std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             gtest_ar.message_.ptr_);
  local_58 = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_48,"issues.size()","logger->issueCount()",&local_50,&local_58)
  ;
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar3) {
    testing::Message::Message(local_70);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0xf9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  local_90 = std::
             vector<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_>::
             size(cellmlElementTypes);
  std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             gtest_ar.message_.ptr_);
  local_98 = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_88,"cellmlElementTypes.size()","logger->issueCount()",
             &local_90,&local_98);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar3) {
    testing::Message::Message(local_a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0xfa,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  local_c0 = std::vector<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_>::size
                       (levels);
  std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             gtest_ar.message_.ptr_);
  local_c8 = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_b8,"levels.size()","logger->issueCount()",&local_c0,&local_c8)
  ;
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar3) {
    testing::Message::Message(local_d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0xfb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  local_f0 = std::
             vector<libcellml::Issue::ReferenceRule,_std::allocator<libcellml::Issue::ReferenceRule>_>
             ::size(referenceRules);
  std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             gtest_ar.message_.ptr_);
  local_f8 = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_e8,"referenceRules.size()","logger->issueCount()",&local_f0,
             &local_f8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar3) {
    testing::Message::Message(local_100);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0xfc,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  local_120 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(urls);
  std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             gtest_ar.message_.ptr_);
  local_128 = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_118,"urls.size()","logger->issueCount()",&local_120,&local_128
            );
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar3) {
    testing::Message::Message(local_130);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0xfd,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i,local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
    testing::Message::~Message(local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  gtest_ar_5.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    sVar1.ptr_ = gtest_ar_5.message_.ptr_;
    std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               gtest_ar.message_.ptr_);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             libcellml::Logger::issueCount();
    sVar2 = gtest_ar_5.message_;
    bVar3 = false;
    if (sVar1.ptr_ < pbVar5) {
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(issues);
      bVar3 = sVar2.ptr_ < pbVar5;
    }
    if (!bVar3) break;
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(issues,(size_type)gtest_ar_5.message_.ptr_);
    std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               gtest_ar.message_.ptr_);
    libcellml::Logger::issue((ulong)&local_180);
    std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &local_180);
    libcellml::Issue::description_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_150,"issues.at(i)","logger->issue(i)->description()",pvVar6,
               &local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_180);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
    if (!bVar3) {
      testing::Message::Message(local_188);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0xff,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_188);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(local_188);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
    lhs = std::vector<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_>::
          at(cellmlElementTypes,(size_type)gtest_ar_5.message_.ptr_);
    std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               gtest_ar.message_.ptr_);
    libcellml::Logger::issue((ulong)&local_1c8);
    std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &local_1c8);
    libcellml::Issue::item();
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&local_1b8);
    local_1a4 = libcellml::AnyCellmlElement::type();
    testing::internal::EqHelper<false>::
    Compare<libcellml::CellmlElementType,libcellml::CellmlElementType>
              ((EqHelper<false> *)local_1a0,"cellmlElementTypes.at(i)",
               "logger->issue(i)->item()->type()",lhs,&local_1a4);
    std::shared_ptr<libcellml::AnyCellmlElement>::~shared_ptr(&local_1b8);
    std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_1c8);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
    if (!bVar3) {
      testing::Message::Message(local_1d0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0x100,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,local_1d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(local_1d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
    lhs_00 = std::vector<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_>::at
                       (levels,(size_type)gtest_ar_5.message_.ptr_);
    std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               gtest_ar.message_.ptr_);
    libcellml::Logger::issue((ulong)&local_200);
    std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &local_200);
    local_1ec = libcellml::Issue::level();
    testing::internal::EqHelper<false>::Compare<libcellml::Issue::Level,libcellml::Issue::Level>
              ((EqHelper<false> *)local_1e8,"levels.at(i)","logger->issue(i)->level()",lhs_00,
               &local_1ec);
    std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_200);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
    if (!bVar3) {
      testing::Message::Message(local_208);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0x101,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_208);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
      testing::Message::~Message(local_208);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
    lhs_01 = std::
             vector<libcellml::Issue::ReferenceRule,_std::allocator<libcellml::Issue::ReferenceRule>_>
             ::at(referenceRules,(size_type)gtest_ar_5.message_.ptr_);
    std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               gtest_ar.message_.ptr_);
    libcellml::Logger::issue((ulong)&local_238);
    std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &local_238);
    local_224 = libcellml::Issue::referenceRule();
    testing::internal::EqHelper<false>::
    Compare<libcellml::Issue::ReferenceRule,libcellml::Issue::ReferenceRule>
              ((EqHelper<false> *)local_220,"referenceRules.at(i)",
               "logger->issue(i)->referenceRule()",lhs_01,&local_224);
    std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_238);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
    if (!bVar3) {
      testing::Message::Message(local_240);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0x102,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,local_240);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(local_240);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(urls,(size_type)gtest_ar_5.message_.ptr_);
    std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               gtest_ar.message_.ptr_);
    libcellml::Logger::issue((ulong)&local_288);
    std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &local_288);
    libcellml::Issue::url_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_258,"urls.at(i)","logger->issue(i)->url()",pvVar6,&local_278
              );
    std::__cxx11::string::~string((string *)&local_278);
    std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_288);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
    if (!bVar3) {
      testing::Message::Message(local_290);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
      testing::internal::AssertHelper::AssertHelper
                (local_298,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0x103,pcVar4);
      testing::internal::AssertHelper::operator=(local_298,local_290);
      testing::internal::AssertHelper::~AssertHelper(local_298);
      testing::Message::~Message(local_290);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
    gtest_ar_5.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &(gtest_ar_5.message_.ptr_)->field_0x1;
  }
  return;
}

Assistant:

void expectEqualIssuesCellmlElementTypesLevelsReferenceRulesUrls(const std::vector<std::string> &issues,
                                                                 const std::vector<libcellml::CellmlElementType> &cellmlElementTypes,
                                                                 const std::vector<libcellml::Issue::Level> &levels,
                                                                 const std::vector<libcellml::Issue::ReferenceRule> &referenceRules,
                                                                 const std::vector<std::string> &urls,
                                                                 const libcellml::LoggerPtr &logger)
{
    EXPECT_EQ(issues.size(), logger->issueCount());
    EXPECT_EQ(cellmlElementTypes.size(), logger->issueCount());
    EXPECT_EQ(levels.size(), logger->issueCount());
    EXPECT_EQ(referenceRules.size(), logger->issueCount());
    EXPECT_EQ(urls.size(), logger->issueCount());
    for (size_t i = 0; i < logger->issueCount() && i < issues.size(); ++i) {
        EXPECT_EQ(issues.at(i), logger->issue(i)->description());
        EXPECT_EQ(cellmlElementTypes.at(i), logger->issue(i)->item()->type());
        EXPECT_EQ(levels.at(i), logger->issue(i)->level());
        EXPECT_EQ(referenceRules.at(i), logger->issue(i)->referenceRule());
        EXPECT_EQ(urls.at(i), logger->issue(i)->url());
    }
}